

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void idx2::Resize<signed_char>(array<signed_char> *Array,i64 NewSize)

{
  byte *pbVar1;
  long lVar2;
  
  if (Array->Capacity < NewSize) {
    GrowCapacity<signed_char>(Array,NewSize);
  }
  lVar2 = Array->Size;
  if (lVar2 < NewSize) {
    pbVar1 = (Array->Buffer).Data;
    for (; NewSize != lVar2; lVar2 = lVar2 + 1) {
      pbVar1[lVar2] = '\0';
    }
  }
  Array->Size = NewSize;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}